

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O0

Value * cmDumpCodeModel(Value *__return_storage_ptr__,cmake *cm)

{
  Value *this;
  Value local_48;
  undefined1 local_19;
  cmake *local_18;
  cmake *cm_local;
  Value *result;
  
  local_19 = 0;
  local_18 = cm;
  cm_local = (cmake *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  DumpConfigurationsList(&local_48,local_18);
  this = Json::Value::operator[](__return_storage_ptr__,&kCONFIGURATIONS_KEY_abi_cxx11_);
  Json::Value::operator=(this,&local_48);
  Json::Value::~Value(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmDumpCodeModel(const cmake* cm)
{
  Json::Value result = Json::objectValue;
  result[kCONFIGURATIONS_KEY] = DumpConfigurationsList(cm);
  return result;
}